

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeof.h
# Opt level: O1

void __thiscall
dap::BasicTypeInfo<dap::ProgressStartEvent>::destruct
          (BasicTypeInfo<dap::ProgressStartEvent> *this,void *ptr)

{
  if (*(long **)((long)ptr + 0x70) != (long *)((long)ptr + 0x80)) {
    operator_delete(*(long **)((long)ptr + 0x70),*(long *)((long)ptr + 0x80) + 1);
  }
  if (*(long **)((long)ptr + 0x40) != (long *)((long)ptr + 0x50)) {
    operator_delete(*(long **)((long)ptr + 0x40),*(long *)((long)ptr + 0x50) + 1);
  }
  if (*(long **)((long)ptr + 8) != (long *)((long)ptr + 0x18)) {
    operator_delete(*(long **)((long)ptr + 8),*(long *)((long)ptr + 0x18) + 1);
    return;
  }
  return;
}

Assistant:

inline void destruct(void* ptr) const override {
    reinterpret_cast<T*>(ptr)->~T();
  }